

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool anon_unknown.dwarf_3fb6e::UpdateOptionsFromCommandLine(Options *options,int argc,char **argv)

{
  bool bVar1;
  invalid_argument *this;
  Options *this_00;
  allocator local_ea;
  allocator local_e9;
  locale local_e8 [8];
  locale local_e0 [8];
  string arg;
  string local_b8;
  string local_98;
  int i;
  int argc_local;
  anon_class_24_3_c76584a5 getNextArg;
  char **argv_local;
  
  getNextArg.argc = &argc_local;
  getNextArg.argv = &argv_local;
  getNextArg.i = &i;
  i = 1;
  argc_local = argc;
  argv_local = argv;
  do {
    if (argc_local <= i) {
      if ((options->GraphicsPlugin)._M_string_length == 0) {
        std::__cxx11::string::string
                  ((string *)&arg,"GraphicsPlugin parameter is required",(allocator *)&local_b8);
        Log::Write(Error,&arg);
        std::__cxx11::string::~string((string *)&arg);
        ShowHelp();
LAB_0010a254:
        bVar1 = false;
      }
      else {
        bVar1 = true;
        Options::ParseStrings(options);
      }
      return bVar1;
    }
    (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
    operator()[abi_cxx11_(&arg,&getNextArg);
    std::__cxx11::string::string((string *)&local_b8,"--graphics",&local_e9);
    std::locale::locale(local_e0);
    bVar1 = EqualsIgnoreCase(&arg,&local_b8,local_e0);
    if (bVar1) {
      std::locale::~locale(local_e0);
      std::__cxx11::string::~string((string *)&local_b8);
LAB_00109df8:
      (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
      operator()[abi_cxx11_(&local_b8,&getNextArg);
      this_00 = options;
LAB_00109e06:
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      std::__cxx11::string::string((string *)&local_98,"-g",&local_ea);
      std::locale::locale(local_e8);
      bVar1 = EqualsIgnoreCase(&arg,&local_98,local_e8);
      std::locale::~locale(local_e8);
      std::__cxx11::string::~string((string *)&local_98);
      std::locale::~locale(local_e0);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) goto LAB_00109df8;
      std::__cxx11::string::string((string *)&local_b8,"--formfactor",&local_e9);
      std::locale::locale(local_e0);
      bVar1 = EqualsIgnoreCase(&arg,&local_b8,local_e0);
      if (bVar1) {
        std::locale::~locale(local_e0);
        std::__cxx11::string::~string((string *)&local_b8);
LAB_00109ee3:
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(&local_b8,&getNextArg);
        this_00 = (Options *)&options->FormFactor;
        goto LAB_00109e06;
      }
      std::__cxx11::string::string((string *)&local_98,"-ff",&local_ea);
      std::locale::locale(local_e8);
      bVar1 = EqualsIgnoreCase(&arg,&local_98,local_e8);
      std::locale::~locale(local_e8);
      std::__cxx11::string::~string((string *)&local_98);
      std::locale::~locale(local_e0);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) goto LAB_00109ee3;
      std::__cxx11::string::string((string *)&local_b8,"--viewconfig",&local_e9);
      std::locale::locale(local_e0);
      bVar1 = EqualsIgnoreCase(&arg,&local_b8,local_e0);
      if (bVar1) {
        std::locale::~locale(local_e0);
        std::__cxx11::string::~string((string *)&local_b8);
LAB_00109fab:
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(&local_b8,&getNextArg);
        this_00 = (Options *)&options->ViewConfiguration;
        goto LAB_00109e06;
      }
      std::__cxx11::string::string((string *)&local_98,"-vc",&local_ea);
      std::locale::locale(local_e8);
      bVar1 = EqualsIgnoreCase(&arg,&local_98,local_e8);
      std::locale::~locale(local_e8);
      std::__cxx11::string::~string((string *)&local_98);
      std::locale::~locale(local_e0);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) goto LAB_00109fab;
      std::__cxx11::string::string((string *)&local_b8,"--blendmode",&local_e9);
      std::locale::locale(local_e0);
      bVar1 = EqualsIgnoreCase(&arg,&local_b8,local_e0);
      if (bVar1) {
        std::locale::~locale(local_e0);
        std::__cxx11::string::~string((string *)&local_b8);
LAB_0010a073:
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(&local_b8,&getNextArg);
        this_00 = (Options *)&options->EnvironmentBlendMode;
        goto LAB_00109e06;
      }
      std::__cxx11::string::string((string *)&local_98,"-bm",&local_ea);
      std::locale::locale(local_e8);
      bVar1 = EqualsIgnoreCase(&arg,&local_98,local_e8);
      std::locale::~locale(local_e8);
      std::__cxx11::string::~string((string *)&local_98);
      std::locale::~locale(local_e0);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) goto LAB_0010a073;
      std::__cxx11::string::string((string *)&local_b8,"--space",&local_e9);
      std::locale::locale(local_e0);
      bVar1 = EqualsIgnoreCase(&arg,&local_b8,local_e0);
      if (bVar1) {
        std::locale::~locale(local_e0);
        std::__cxx11::string::~string((string *)&local_b8);
LAB_0010a13b:
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(&local_b8,&getNextArg);
        this_00 = (Options *)&options->AppSpace;
        goto LAB_00109e06;
      }
      std::__cxx11::string::string((string *)&local_98,"-s",&local_ea);
      std::locale::locale(local_e8);
      bVar1 = EqualsIgnoreCase(&arg,&local_98,local_e8);
      std::locale::~locale(local_e8);
      std::__cxx11::string::~string((string *)&local_98);
      std::locale::~locale(local_e0);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) goto LAB_0010a13b;
      std::__cxx11::string::string((string *)&local_b8,"--verbose",&local_e9);
      std::locale::locale(local_e0);
      bVar1 = EqualsIgnoreCase(&arg,&local_b8,local_e0);
      if (bVar1) {
        std::locale::~locale(local_e0);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        std::__cxx11::string::string((string *)&local_98,"-v",&local_ea);
        std::locale::locale(local_e8);
        bVar1 = EqualsIgnoreCase(&arg,&local_98,local_e8);
        std::locale::~locale(local_e8);
        std::__cxx11::string::~string((string *)&local_98);
        std::locale::~locale(local_e0);
        std::__cxx11::string::~string((string *)&local_b8);
        if (!bVar1) {
          std::__cxx11::string::string((string *)&local_b8,"--help",&local_e9);
          std::locale::locale(local_e0);
          bVar1 = EqualsIgnoreCase(&arg,&local_b8,local_e0);
          if (bVar1) {
            std::locale::~locale(local_e0);
            std::__cxx11::string::~string((string *)&local_b8);
          }
          else {
            std::__cxx11::string::string((string *)&local_98,"-h",&local_ea);
            std::locale::locale(local_e8);
            bVar1 = EqualsIgnoreCase(&arg,&local_98,local_e8);
            std::locale::~locale(local_e8);
            std::__cxx11::string::~string((string *)&local_98);
            std::locale::~locale(local_e0);
            std::__cxx11::string::~string((string *)&local_b8);
            if (!bVar1) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              Fmt_abi_cxx11_(&local_b8,"Unknown argument: %s",arg._M_dataplus._M_p);
              std::invalid_argument::invalid_argument(this,(string *)&local_b8);
              __cxa_throw(this,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
          }
          ShowHelp();
          std::__cxx11::string::~string((string *)&arg);
          goto LAB_0010a254;
        }
      }
      Log::SetLevel(Verbose);
    }
    std::__cxx11::string::~string((string *)&arg);
  } while( true );
}

Assistant:

bool UpdateOptionsFromCommandLine(Options& options, int argc, char* argv[]) {
    int i = 1;  // Index 0 is the program name and is skipped.

    auto getNextArg = [&] {
        if (i >= argc) {
            throw std::invalid_argument("Argument parameter missing");
        }

        return std::string(argv[i++]);
    };

    while (i < argc) {
        const std::string arg = getNextArg();
        if (EqualsIgnoreCase(arg, "--graphics") || EqualsIgnoreCase(arg, "-g")) {
            options.GraphicsPlugin = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--formfactor") || EqualsIgnoreCase(arg, "-ff")) {
            options.FormFactor = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--viewconfig") || EqualsIgnoreCase(arg, "-vc")) {
            options.ViewConfiguration = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--blendmode") || EqualsIgnoreCase(arg, "-bm")) {
            options.EnvironmentBlendMode = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--space") || EqualsIgnoreCase(arg, "-s")) {
            options.AppSpace = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--verbose") || EqualsIgnoreCase(arg, "-v")) {
            Log::SetLevel(Log::Level::Verbose);
        } else if (EqualsIgnoreCase(arg, "--help") || EqualsIgnoreCase(arg, "-h")) {
            ShowHelp();
            return false;
        } else {
            throw std::invalid_argument(Fmt("Unknown argument: %s", arg.c_str()));
        }
    }

    // Check for required parameters.
    if (options.GraphicsPlugin.empty()) {
        Log::Write(Log::Level::Error, "GraphicsPlugin parameter is required");
        ShowHelp();
        return false;
    }

    try {
        options.ParseStrings();
    } catch (std::invalid_argument& ia) {
        Log::Write(Log::Level::Error, ia.what());
        ShowHelp();
        return false;
    }
    return true;
}